

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueNameGenerator.cpp
# Opt level: O1

void __thiscall
Assimp::MDL::HalfLife::UniqueNameGenerator::make_unique
          (UniqueNameGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  size_t __n;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  pointer pbVar7;
  long lVar8;
  _Rb_tree_header *p_Var9;
  _Link_type p_Var10;
  _List_node_base *p_Var11;
  byte extraout_var;
  uchar *puVar12;
  _Base_ptr p_Var13;
  _Rb_tree_node_base *p_Var14;
  _Base_ptr p_Var15;
  iterator it;
  unsigned_long *puVar16;
  iterator iVar17;
  _Rb_tree_node_base *p_Var18;
  size_t id;
  bool bVar19;
  bool bVar20;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar21;
  vector<unsigned_long,_std::allocator<unsigned_long>_> empty_names_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> template_name_duplicates;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
  names_to_duplicates;
  anon_class_8_1_8991fb9c format_name;
  string template_name_with_separator;
  anon_class_24_3_9cb0d701 generate_unique_name;
  _List_node_base *local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_170;
  undefined1 local_168 [32];
  _Rb_tree_node_base local_148;
  unsigned_long *local_128;
  iterator iStack_120;
  unsigned_long *local_118;
  _Rb_tree_node_base *local_108;
  _Rb_tree_node_base *p_Stack_100;
  _Base_ptr local_f8;
  _Base_ptr p_Stack_f0;
  unsigned_long *local_e8;
  iterator iStack_e0;
  unsigned_long *local_d8;
  UniqueNameGenerator *local_d0;
  _Rb_tree_node_base *local_c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
  local_c0;
  UniqueNameGenerator *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
  *local_68;
  UniqueNameGenerator **local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_128 = (unsigned_long *)0x0;
  iStack_120._M_current = (unsigned_long *)0x0;
  local_118 = (unsigned_long *)0x0;
  local_d8 = (unsigned_long *)0x0;
  local_e8 = (unsigned_long *)0x0;
  iStack_e0._M_current = (unsigned_long *)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar17._M_current = (unsigned_long *)this;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::operator+(&local_88,&this->template_name_,&this->separator_);
  local_60 = &local_90;
  local_68 = &local_c0;
  local_178 = (_List_node_base *)0x0;
  pbVar7 = (names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_170 = names;
  local_d0 = this;
  local_90 = this;
  local_58 = names;
  if ((names->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
    do {
      lVar8 = std::__cxx11::string::find_first_not_of
                        ((char)((long)local_178 << 5) + (char)pbVar7,0x20);
      if (lVar8 == -1) {
        iVar17._M_current = iStack_120._M_current;
        if (iStack_120._M_current == local_118) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_128,iStack_120,
                     (unsigned_long *)&local_178);
        }
        else {
          *iStack_120._M_current = (unsigned_long)local_178;
          iStack_120._M_current = iStack_120._M_current + 1;
        }
      }
      else {
        pbVar2 = (names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar7 = pbVar2 + (long)local_178;
        __n = pbVar2[(long)local_178]._M_string_length;
        if (__n == (this->template_name_)._M_string_length) {
          if (__n == 0) {
            bVar19 = true;
          }
          else {
            iVar5 = bcmp((pbVar7->_M_dataplus)._M_p,(this->template_name_)._M_dataplus._M_p,__n);
            bVar19 = iVar5 == 0;
          }
        }
        else {
          bVar19 = false;
        }
        bVar20 = true;
        if (!bVar19) {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)pbVar7);
          if (local_48 == local_88._M_string_length) {
            if (local_48 != 0) {
              iVar5 = bcmp(local_50,local_88._M_dataplus._M_p,local_48);
              bVar20 = iVar5 == 0;
            }
          }
          else {
            bVar20 = false;
          }
        }
        names = local_170;
        if ((!bVar19) && (local_50 != local_40)) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (bVar20) {
          if (iStack_e0._M_current == local_d8) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_e8,iStack_e0,
                       (unsigned_long *)&local_178);
          }
          else {
            *iStack_e0._M_current = (unsigned_long)local_178;
            iStack_e0._M_current = iStack_e0._M_current + 1;
          }
        }
        pbVar7 = (names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + (long)local_178;
        p_Var13 = &local_c0._M_impl.super__Rb_tree_header._M_header;
        for (p_Var15 = local_c0._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var15 != (_Rb_tree_header *)0x0;
            p_Var15 = (&p_Var15->_M_left)[uVar6 >> 0x1f]) {
          uVar6 = std::__cxx11::string::compare((string *)(p_Var15 + 1));
          if (-1 < (int)uVar6) {
            p_Var13 = p_Var15;
          }
        }
        p_Var9 = &local_c0._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var13 != p_Var9) {
          iVar5 = std::__cxx11::string::compare((string *)pbVar7);
          p_Var9 = (_Rb_tree_header *)p_Var13;
          if (iVar5 < 0) {
            p_Var9 = &local_c0._M_impl.super__Rb_tree_header;
          }
        }
        if (p_Var9 == &local_c0._M_impl.super__Rb_tree_header) {
          pbVar7 = (names->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_f8 = (_Base_ptr)0x0;
          p_Stack_f0 = (_Base_ptr)0x0;
          local_168._0_8_ = local_168 + 0x10;
          pcVar3 = pbVar7[(long)local_178]._M_dataplus._M_p;
          local_108 = (_Rb_tree_node_base *)&local_108;
          p_Stack_100 = (_Rb_tree_node_base *)&local_108;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_168,pcVar3,pcVar3 + pbVar7[(long)local_178]._M_string_length);
          local_148._0_8_ = local_108;
          local_148._M_parent = p_Stack_100;
          local_148._M_left = local_f8;
          p_Var18 = &local_148;
          p_Var13 = &local_148;
          if (local_108 != (_Rb_tree_node_base *)&local_108) {
            *(_Rb_tree_node_base **)p_Stack_100 = &local_148;
            *(_Rb_tree_node_base **)(local_148._0_8_ + 8) = &local_148;
            local_f8 = (_Base_ptr)0x0;
            p_Var18 = (_Rb_tree_node_base *)local_148._0_8_;
            p_Var13 = local_148._M_parent;
            local_108 = (_Rb_tree_node_base *)&local_108;
            p_Stack_100 = (_Rb_tree_node_base *)&local_108;
          }
          local_148._M_parent = p_Var13;
          local_148._0_8_ = p_Var18;
          local_148._M_right = p_Stack_f0;
          iVar17._M_current = (unsigned_long *)local_168;
          pVar21 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                   ::_M_get_insert_unique_pos(&local_c0,(key_type *)iVar17._M_current);
          p_Var14 = pVar21.second;
          p_Var18 = (_Rb_tree_node_base *)local_148._0_8_;
          this = local_d0;
          if (p_Var14 != (_Rb_tree_node_base *)0x0) {
            bVar19 = true;
            if (&local_c0._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var14 &&
                pVar21.first == (_Rb_tree_node_base *)0x0) {
              std::__cxx11::string::compare((string *)local_168);
              bVar19 = (bool)(extraout_var >> 7);
            }
            iVar17._M_current = (unsigned_long *)operator_new(0x60);
            *(uchar **)(((_Link_type)iVar17._M_current)->_M_storage)._M_storage =
                 (((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&((_Link_type)iVar17._M_current)->_M_storage,local_168._0_8_,
                       (undefined1 *)((long)(_Rb_tree_color *)local_168._8_8_ + local_168._0_8_));
            puVar12 = (((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x20;
            *(undefined8 *)((((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x20) =
                 local_148._0_8_;
            *(_Base_ptr *)((((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x28) =
                 local_148._M_parent;
            *(_Base_ptr *)((((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x30) =
                 local_148._M_left;
            if ((_Rb_tree_node_base *)local_148._0_8_ == &local_148) {
              *(uchar **)((((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x28) = puVar12
              ;
              *(uchar **)((((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x20) = puVar12
              ;
            }
            else {
              *(uchar **)local_148._M_parent = puVar12;
              *(uchar **)(*(long *)puVar12 + 8) = puVar12;
              local_148._M_left = (_Base_ptr)0x0;
              local_148._0_8_ = &local_148;
              local_148._M_parent = &local_148;
            }
            *(_Base_ptr *)((((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x38) =
                 local_148._M_right;
            std::_Rb_tree_insert_and_rebalance
                      (bVar19,(_Rb_tree_node_base *)iVar17._M_current,p_Var14,
                       &local_c0._M_impl.super__Rb_tree_header._M_header);
            local_c0._M_impl.super__Rb_tree_header._M_node_count =
                 local_c0._M_impl.super__Rb_tree_header._M_node_count + 1;
            p_Var18 = (_Rb_tree_node_base *)local_148._0_8_;
            this = local_d0;
            names = local_170;
          }
          while (local_d0 = this, p_Var18 != &local_148) {
            p_Var14 = *(_Rb_tree_node_base **)p_Var18;
            iVar17._M_current = (unsigned_long *)0x18;
            operator_delete(p_Var18,0x18);
            p_Var18 = p_Var14;
            this = local_d0;
          }
          p_Var18 = local_108;
          if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
            iVar17._M_current =
                 (unsigned_long *)((long)&((_Base_ptr)local_168._16_8_)->_M_color + 1);
            operator_delete((void *)local_168._0_8_,(ulong)iVar17._M_current);
            p_Var18 = local_108;
          }
          while (p_Var18 != (_Rb_tree_node_base *)&local_108) {
            p_Var14 = *(_Rb_tree_node_base **)p_Var18;
            iVar17._M_current = (unsigned_long *)0x18;
            operator_delete(p_Var18,0x18);
            p_Var18 = p_Var14;
          }
        }
        else {
          p_Var10 = (_Link_type)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                                  *)&local_c0,
                                 (names->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + (long)local_178);
          p_Var11 = (_List_node_base *)operator_new(0x18);
          p_Var11[1]._M_next = local_178;
          iVar17._M_current = (unsigned_long *)p_Var10;
          std::__detail::_List_node_base::_M_hook(p_Var11);
          paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&(p_Var10->super__Rb_tree_node_base)._M_left;
          paVar1->_M_allocated_capacity = paVar1->_M_allocated_capacity + 1;
        }
      }
      local_178 = (_List_node_base *)((long)&local_178->_M_next + 1);
      pbVar7 = (names->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (local_178 <
             (_List_node_base *)
             ((long)(names->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5));
  }
  if ((_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_c0._M_impl.super__Rb_tree_header) {
    p_Var13 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      p_Var18 = *(_Rb_tree_node_base **)(p_Var13 + 2);
      local_c8 = p_Var13;
      if (p_Var18 != p_Var13 + 2) {
        do {
          make_unique(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0
          ::operator()::string_const___const((string *)local_168,&local_68,(string *)(p_Var13 + 1));
          iVar17._M_current = (unsigned_long *)local_168;
          std::__cxx11::string::operator=
                    ((string *)
                     ((local_170->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (long)p_Var18->_M_left),
                     (string *)local_168);
          if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
            iVar17._M_current = (unsigned_long *)((long)(_Rb_tree_color *)local_168._16_8_ + 1);
            operator_delete((void *)local_168._0_8_,(ulong)iVar17._M_current);
          }
          p_Var18 = *(_Rb_tree_node_base **)p_Var18;
        } while (p_Var18 != p_Var13 + 2);
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(local_c8);
    } while ((_Rb_tree_header *)p_Var13 != &local_c0._M_impl.super__Rb_tree_header);
  }
  puVar16 = local_128;
  if (iStack_e0._M_current == local_e8) {
    if (local_128 != iStack_120._M_current) {
      lVar8 = 0;
      id = 0;
      do {
        make_unique(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1::
        operator()::string_const__unsigned_long__const
                  ((string *)local_168,&local_90,&local_d0->template_name_,id);
        iVar17._M_current = (unsigned_long *)local_168;
        std::__cxx11::string::operator=
                  ((string *)
                   ((local_170->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + puVar16[id]),(string *)local_168);
        if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
          iVar17._M_current = (unsigned_long *)((long)(_Rb_tree_color *)local_168._16_8_ + 1);
          operator_delete((void *)local_168._0_8_,(ulong)iVar17._M_current);
        }
        id = id + 1;
        lVar4 = lVar8 + 8;
        lVar8 = lVar8 + 8;
      } while ((unsigned_long *)((long)puVar16 + lVar4) != iStack_120._M_current);
    }
  }
  else if (local_128 != iStack_120._M_current) {
    do {
      make_unique(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0::
      operator()::string_const___const((string *)local_168,&local_68,&local_d0->template_name_);
      iVar17._M_current = (unsigned_long *)local_168;
      std::__cxx11::string::operator=
                ((string *)
                 ((local_170->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + *puVar16),(string *)local_168);
      if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
        iVar17._M_current = (unsigned_long *)((long)(_Rb_tree_color *)local_168._16_8_ + 1);
        operator_delete((void *)local_168._0_8_,(ulong)iVar17._M_current);
      }
      puVar16 = puVar16 + 1;
    } while (puVar16 != iStack_120._M_current);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    iVar17._M_current = (unsigned_long *)(local_88.field_2._M_allocated_capacity + 1);
    operator_delete(local_88._M_dataplus._M_p,(ulong)iVar17._M_current);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
              *)local_c0._M_impl.super__Rb_tree_header._M_header._M_parent,
             (_Link_type)iVar17._M_current);
  if (local_e8 != (unsigned_long *)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  if (local_128 != (unsigned_long *)0x0) {
    operator_delete(local_128,(long)local_118 - (long)local_128);
  }
  return;
}

Assistant:

void UniqueNameGenerator::make_unique(std::vector<std::string> &names) {
    struct DuplicateInfo {
        DuplicateInfo() :
            indices(),
            next_id(0) {
        }

        std::list<size_t> indices;
        size_t next_id;
    };

    std::vector<size_t> empty_names_indices;
    std::vector<size_t> template_name_duplicates;
    std::map<std::string, DuplicateInfo> names_to_duplicates;

    const std::string template_name_with_separator(template_name_ + separator_);

    auto format_name = [&](const std::string &base_name, size_t id) -> std::string {
        return base_name + separator_ + std::to_string(id);
    };

    auto generate_unique_name = [&](const std::string &base_name) -> std::string {
        auto *duplicate_info = &names_to_duplicates[base_name];

        std::string new_name = "";

        bool found_identical_name;
        bool tried_with_base_name_only = false;
        do {
            // Assume that no identical name exists.
            found_identical_name = false;

            if (!tried_with_base_name_only) {
                // First try with only the base name.
                new_name = base_name;
            } else {
                // Create the name expected to be unique.
                new_name = format_name(base_name, duplicate_info->next_id);
            }

            // Check in the list of duplicates for an identical name.
            for (size_t i = 0;
                    i < names.size() &&
                    !found_identical_name;
                    ++i) {
                if (new_name == names[i])
                    found_identical_name = true;
            }

            if (tried_with_base_name_only)
                ++duplicate_info->next_id;

            tried_with_base_name_only = true;

        } while (found_identical_name);

        return new_name;
    };

    for (size_t i = 0; i < names.size(); ++i) {
        // Check for empty names.
        if (names[i].find_first_not_of(' ') == std::string::npos) {
            empty_names_indices.push_back(i);
            continue;
        }

        /* Check for potential duplicate.
        a) Either if this name is the same as the template name or
        b) <template name><separator> is found at the beginning. */
        if (names[i] == template_name_ ||
                names[i].substr(0, template_name_with_separator.length()) == template_name_with_separator)
            template_name_duplicates.push_back(i);

        // Map each unique name to it's duplicate.
        if (names_to_duplicates.count(names[i]) == 0)
            names_to_duplicates.insert({ names[i], DuplicateInfo()});
        else
            names_to_duplicates[names[i]].indices.push_back(i);
    }

    // Make every non-empty name unique.
    for (auto it = names_to_duplicates.begin();
            it != names_to_duplicates.end(); ++it) {
        for (auto it2 = it->second.indices.begin();
                it2 != it->second.indices.end();
                ++it2)
            names[*it2] = generate_unique_name(it->first);
    }

    // Generate a unique name for every empty string.
    if (template_name_duplicates.size()) {
        // At least one string ressembles to <template name>.
        for (auto it = empty_names_indices.begin();
                it != empty_names_indices.end(); ++it)
            names[*it] = generate_unique_name(template_name_);
    } else {
        // No string alike <template name> exists.
        size_t i = 0;
        for (auto it = empty_names_indices.begin();
                it != empty_names_indices.end(); ++it, ++i)
            names[*it] = format_name(template_name_, i);
    }
}